

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::LinearSegmentParameter
          (LinearSegmentParameter *this,KUINT8 SegNum,KUINT8 Mod,LinearObjectAppearance *A,
          WorldCoordinates *Loc,EulerAngles *Ori,KUINT16 Length,KUINT16 Width,KUINT16 Height,
          KUINT16 Depth)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LinearSegmentParameter_00225c10;
  this->m_ui8SegNum = SegNum;
  (this->m_ObjApr).super_ObjectAppearance.m_GeneralAppearanceUnion =
       (A->super_ObjectAppearance).m_GeneralAppearanceUnion;
  (this->m_ObjApr).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__LinearObjectAppearance_00225bb8;
  *(undefined4 *)&(this->m_ObjApr).super_ObjectAppearance.field_0xc =
       *(undefined4 *)&(A->super_ObjectAppearance).field_0xc;
  (this->m_Loc).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021feb0;
  KVar1 = Loc->m_f64Y;
  (this->m_Loc).m_f64X = Loc->m_f64X;
  (this->m_Loc).m_f64Y = KVar1;
  (this->m_Loc).m_f64Z = Loc->m_f64Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00224b58;
  KVar2 = Ori->m_f32Theta;
  (this->m_Ori).m_f32Psi = Ori->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Ori->m_f32Phi;
  this->m_ui16Length = Length;
  this->m_ui16Width = Width;
  this->m_ui16Height = Height;
  this->m_ui16Depth = Depth;
  this->m_ui32Padding = 0;
  (this->m_ModificationUnion).m_ui8Modifications = Mod;
  return;
}

Assistant:

LinearSegmentParameter::LinearSegmentParameter( KUINT8 SegNum, KUINT8 Mod, const LinearObjectAppearance & A,
        const WorldCoordinates & Loc, const EulerAngles & Ori,
        KUINT16 Length, KUINT16 Width, KUINT16 Height, KUINT16 Depth ) :
    m_ui8SegNum( SegNum ),
    m_ObjApr( A ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_ui16Length( Length ),
    m_ui16Width( Width ),
    m_ui16Height( Height ),
    m_ui16Depth( Depth ),
    m_ui32Padding( 0 )
{
    m_ModificationUnion.m_ui8Modifications = Mod;
}